

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

bool matchWhileUnsplitting
               (char *buffer,int buffer_len,int start,char *needle,int needle_len,int *matchlen,
               int *lines)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  
  iVar1 = start;
  if (needle_len < 1) {
LAB_00196d91:
    *matchlen = iVar1 - start;
    bVar2 = true;
  }
  else if (start < buffer_len) {
    uVar3 = 1;
    bVar2 = false;
    do {
      if (buffer[iVar1] != needle[uVar3 - 1]) {
        return bVar2;
      }
      iVar1 = skipEscapedLineEnds(buffer,buffer_len,iVar1 + 1,lines);
      if ((uint)needle_len == uVar3) goto LAB_00196d91;
      bVar2 = (uint)needle_len <= uVar3;
      uVar3 = uVar3 + 1;
    } while (iVar1 < buffer_len);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool matchWhileUnsplitting(const char *buffer, int buffer_len, int start,
                                  const char *needle, int needle_len,
                                  int *matchlen, int *lines)
{
    int x = start;
    for (int n = 0; n < needle_len;
         n++, x = skipEscapedLineEnds(buffer, buffer_len, x + 1, lines)) {
        if (x >= buffer_len || buffer[x] != needle[n])
            return false;
    }
    // That also skipped any remaining BSNLs immediately after the match.

    // Tell caller how long the match was:
    *matchlen = x - start;

    return true;
}